

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgobs.cpp
# Opt level: O0

Am_Wrapper * ship_image_proc(Am_Object *self)

{
  int iVar1;
  Am_Value *this;
  Am_Object local_28;
  int local_1c;
  Am_Object *pAStack_18;
  SP_Ship_Type st;
  Am_Object *self_local;
  
  pAStack_18 = self;
  Am_Object::Get_Owner(&local_28,(Am_Slot_Flags)self);
  this = (Am_Value *)Am_Object::Get((ushort)&local_28,(ulong)SHIP_TYPE);
  iVar1 = Am_Value::operator_cast_to_int(this);
  Am_Object::~Am_Object(&local_28);
  local_1c = iVar1;
  if (iVar1 == 1) {
    self_local = (Am_Object *)
                 Am_Image_Array::operator_cast_to_Am_Wrapper_
                           ((Am_Image_Array *)&SP_Federation_Image);
  }
  else if (iVar1 == 2) {
    self_local = (Am_Object *)
                 Am_Image_Array::operator_cast_to_Am_Wrapper_((Am_Image_Array *)&SP_Klingon_Image);
  }
  else {
    self_local = (Am_Object *)0x0;
  }
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_Image_Formula(ship_image)
{
  SP_Ship_Type st = (int)(self.Get_Owner().Get(SHIP_TYPE));
  if (st == FEDERATION)
    return SP_Federation_Image;
  else if (st == KLINGON)
    return SP_Klingon_Image;
  else {
    //Am_Error("ship_image: Invalid ship type.\n");
    return nullptr;
  }
}